

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

size_t __thiscall
nivalis::util::find_equality
          (util *this,string_view expr,bool allow_ineq,bool enforce_no_adj_comparison)

{
  util uVar1;
  bool bVar2;
  util *puVar3;
  util *puVar4;
  long lVar5;
  size_t sVar6;
  util *puVar7;
  util *in_R10;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  sVar6 = expr._M_len;
  puVar3 = (util *)0xffffffffffffffff;
  puVar4 = puVar3;
  if ((this != (util *)0x0) && (this != (util *)0x1)) {
    puVar7 = (util *)0x0;
    lVar5 = 0;
    do {
      uVar1 = puVar7[sVar6];
      if ((byte)uVar1 < 0x5d) {
        if (uVar1 != (util)0x28) {
          if (uVar1 == (util)0x29) goto LAB_0012505d;
          if (uVar1 != (util)0x5b) goto LAB_0012501a;
        }
LAB_00125058:
        lVar5 = lVar5 + 1;
LAB_00125060:
        bVar8 = true;
      }
      else {
        if ((uVar1 == (util)0x5d) || (uVar1 == (util)0x7d)) {
LAB_0012505d:
          lVar5 = lVar5 + -1;
          goto LAB_00125060;
        }
        if (uVar1 == (util)0x7b) goto LAB_00125058;
LAB_0012501a:
        bVar2 = true;
        bVar8 = bVar2;
        if (lVar5 == 0) {
          puVar4 = puVar7;
          if (uVar1 == (util)0x3d) {
            bVar8 = puVar7 == (util *)0x0;
            if (bVar8) {
              puVar4 = in_R10;
            }
            bVar9 = !bVar8;
joined_r0x0012509b:
            if (!bVar9 || !allow_ineq) {
              lVar5 = 0;
              in_R10 = puVar4;
              goto LAB_00125063;
            }
            if ((((0x3e < (ulong)(byte)puVar7[sVar6 - 1]) ||
                 (bVar8 = bVar2,
                 (0x7000000200000000U >> ((ulong)(byte)puVar7[sVar6 - 1] & 0x3f) & 1) == 0)) &&
                (bVar8 = bVar2, 2 < (byte)((char)puVar7[sVar6 + 1] - 0x3cU))) &&
               (bVar8 = puVar7[sVar6 + 1] == (util)0x21, !bVar8)) {
              in_R10 = puVar7;
            }
          }
          else if ((char)expr._M_str != '\0') {
            bVar9 = ((byte)uVar1 & 0xfd) != 0x3c;
            bVar10 = puVar7 == (util *)0x0;
            bVar8 = bVar10 || bVar9;
            if (bVar10 || bVar9) {
              puVar4 = in_R10;
            }
            bVar9 = !bVar10 && !bVar9;
            goto joined_r0x0012509b;
          }
          lVar5 = 0;
        }
      }
LAB_00125063:
      puVar4 = in_R10;
    } while ((bVar8) && (puVar7 = puVar7 + 1, puVar4 = puVar3, this + -1 != puVar7));
  }
  return (size_t)puVar4;
}

Assistant:

size_t find_equality(std::string_view expr,
        bool allow_ineq,
        bool enforce_no_adj_comparison) {
    if (expr.empty()) return -1;
    size_t stkh = 0;
    for (size_t i = 0; i < expr.size() - 1; ++i) {
        const char c = expr[i];
        if (is_open_bracket(c)) {
            ++stkh;
        } else if (is_close_bracket(c)) {
            --stkh;
        } else if (stkh == 0 &&
                (c == '=' || (allow_ineq && (c == '<' || c== '>')))
                    && i > 0 &&
                   (!enforce_no_adj_comparison ||
                       (!util::is_comp_operator(expr[i-1]) &&
                       expr[i-1] != '!' &&
                       !util::is_comp_operator(expr[i+1]) &&
                       expr[i+1] != '!'))) {
            return i;
        }
    }
    return -1;
}